

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::opt::analysis::ConstantManager::CreateInstruction
          (ConstantManager *this,uint32_t id,Constant *c,uint32_t type_id)

{
  TypeManager *this_00;
  long lVar1;
  long *plVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec;
  undefined4 in_register_0000000c;
  long *plVar3;
  undefined4 in_register_00000034;
  undefined8 *puVar4;
  uint32_t in_R8D;
  uint32_t type;
  uint32_t id_local;
  Op local_a4;
  initializer_list<spvtools::opt::Operand> local_a0;
  IRContext *local_90;
  Operand local_88;
  SmallVector<unsigned_int,_2UL> local_58;
  
  puVar4 = (undefined8 *)CONCAT44(in_register_00000034,id);
  plVar3 = (long *)CONCAT44(in_register_0000000c,type_id);
  id_local = (uint32_t)c;
  if (in_R8D == 0) {
    this_00 = IRContext::get_type_mgr((IRContext *)*puVar4);
    in_R8D = TypeManager::GetId(this_00,(Type *)plVar3[1]);
  }
  type = in_R8D;
  lVar1 = (**(code **)(*plVar3 + 0xb0))(plVar3);
  if (lVar1 == 0) {
    lVar1 = (**(code **)(*plVar3 + 0x80))(plVar3);
    if (lVar1 == 0) {
      plVar2 = (long *)(**(code **)(*plVar3 + 0x70))(plVar3);
      if ((plVar2 == (long *)0x0) &&
         (plVar2 = (long *)(**(code **)(*plVar3 + 0x78))(plVar3), plVar2 == (long *)0x0)) {
        lVar1 = (**(code **)(*plVar3 + 0x88))(plVar3);
        if (lVar1 != 0) {
          CreateCompositeInstruction
                    (this,id,(CompositeConstant *)((ulong)c & 0xffffffff),(uint32_t)lVar1);
          return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
                  )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
                    )this;
        }
        this->ctx_ = (IRContext *)0x0;
        return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
                )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
                  )this;
      }
      local_90 = (IRContext *)*puVar4;
      local_a4 = OpConstant;
      vec = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
            (**(code **)(*plVar2 + 0xc0))(plVar2);
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,vec);
      local_88.type = SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
      local_a0._M_array = &local_88;
      local_a0._M_len = 1;
      MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int&,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
                ((spvtools *)this,&local_90,&local_a4,&type,&id_local,&local_a0);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
      return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
              )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
                )this;
    }
    local_58._vptr_SmallVector = (_func_int **)*puVar4;
    local_a0._M_array =
         (iterator)CONCAT44(local_a0._M_array._4_4_,0x2a - (uint)*(byte *)(lVar1 + 0x28));
  }
  else {
    local_58._vptr_SmallVector = (_func_int **)*puVar4;
    local_a0._M_array = (iterator)CONCAT44(local_a0._M_array._4_4_,0x2e);
  }
  local_88.type = SPV_OPERAND_TYPE_NONE;
  local_88._4_4_ = 0;
  local_88.words._vptr_SmallVector = (_func_int **)0x0;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int&,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)this,(IRContext **)&local_58,(Op *)&local_a0,&type,&id_local,
             (initializer_list<spvtools::opt::Operand> *)&local_88);
  return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Instruction> ConstantManager::CreateInstruction(
    uint32_t id, const Constant* c, uint32_t type_id) const {
  uint32_t type =
      (type_id == 0) ? context()->get_type_mgr()->GetId(c->type()) : type_id;
  if (c->AsNullConstant()) {
    return MakeUnique<Instruction>(context(), spv::Op::OpConstantNull, type, id,
                                   std::initializer_list<Operand>{});
  } else if (const BoolConstant* bc = c->AsBoolConstant()) {
    return MakeUnique<Instruction>(
        context(),
        bc->value() ? spv::Op::OpConstantTrue : spv::Op::OpConstantFalse, type,
        id, std::initializer_list<Operand>{});
  } else if (const IntConstant* ic = c->AsIntConstant()) {
    return MakeUnique<Instruction>(
        context(), spv::Op::OpConstant, type, id,
        std::initializer_list<Operand>{
            Operand(spv_operand_type_t::SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER,
                    ic->words())});
  } else if (const FloatConstant* fc = c->AsFloatConstant()) {
    return MakeUnique<Instruction>(
        context(), spv::Op::OpConstant, type, id,
        std::initializer_list<Operand>{
            Operand(spv_operand_type_t::SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER,
                    fc->words())});
  } else if (const CompositeConstant* cc = c->AsCompositeConstant()) {
    return CreateCompositeInstruction(id, cc, type_id);
  } else {
    return nullptr;
  }
}